

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

void __thiscall
Future<void>::Private::LockFreeQueue<Future<void>::Private::ThreadPool::Job>::LockFreeQueue
          (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this,usize capacity)

{
  ulong uVar1;
  Node *pNVar2;
  usize *puVar3;
  usize uVar4;
  usize uVar5;
  
  uVar1 = capacity - 1 >> 1 | capacity - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  this->_capacityMask = uVar1;
  uVar5 = uVar1 + 1;
  this->_capacity = uVar5;
  pNVar2 = (Node *)operator_new__(uVar5 * 0x20);
  this->_queue = pNVar2;
  puVar3 = &pNVar2->head;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    puVar3[-1] = uVar4;
    *puVar3 = 0xffffffffffffffff;
    puVar3 = puVar3 + 4;
  }
  this->_tail = 0;
  this->_head = 0;
  return;
}

Assistant:

inline Future<void>::Private::LockFreeQueue<T>::LockFreeQueue(usize capacity)
{
  _capacityMask = capacity - 1;
  _capacityMask |= _capacityMask >> 1;
  _capacityMask |= _capacityMask >> 2;
  _capacityMask |= _capacityMask >> 4;
  _capacityMask |= _capacityMask >> 8;
  _capacityMask |= _capacityMask >> 16;
  _capacity = _capacityMask + 1;

  _queue = (Node *)new char[sizeof(Node) * _capacity];
  for (usize i = 0; i < _capacity; ++i)
  {
    _queue[i].tail = i;
    _queue[i].head = -1;
  }

  _tail = 0;
  _head = 0;
}